

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

size_t __thiscall player_t::FixPointers(player_t *this,DObject *old,DObject *rep)

{
  AActor **ppAVar1;
  DBot **ppDVar2;
  AWeapon **ppAVar3;
  DPSprite *pDVar4;
  bool bVar5;
  ulong local_30;
  size_t changed;
  APlayerPawn *replacement;
  DObject *rep_local;
  DObject *old_local;
  player_t *this_local;
  
  bVar5 = this->mo == (APlayerPawn *)old;
  if (bVar5) {
    this->mo = (APlayerPawn *)rep;
  }
  local_30 = (ulong)bVar5;
  ppAVar1 = TObjPtr<AActor>::operator&(&this->poisoner);
  if (*ppAVar1 == (AActor *)old) {
    TObjPtr<AActor>::operator=(&this->poisoner,(AActor *)rep);
    local_30 = local_30 + 1;
  }
  ppAVar1 = TObjPtr<AActor>::operator&(&this->attacker);
  if (*ppAVar1 == (AActor *)old) {
    TObjPtr<AActor>::operator=(&this->attacker,(AActor *)rep);
    local_30 = local_30 + 1;
  }
  ppAVar1 = TObjPtr<AActor>::operator&(&this->camera);
  if (*ppAVar1 == (AActor *)old) {
    TObjPtr<AActor>::operator=(&this->camera,(AActor *)rep);
    local_30 = local_30 + 1;
  }
  ppDVar2 = TObjPtr<DBot>::operator&(&this->Bot);
  if (*ppDVar2 == (DBot *)old) {
    TObjPtr<DBot>::operator=(&this->Bot,(DBot *)rep);
    local_30 = local_30 + 1;
  }
  if (this->ReadyWeapon == (AWeapon *)old) {
    this->ReadyWeapon = (AWeapon *)rep;
    local_30 = local_30 + 1;
  }
  if (this->PendingWeapon == (AWeapon *)old) {
    this->PendingWeapon = (AWeapon *)rep;
    local_30 = local_30 + 1;
  }
  ppAVar3 = TObjPtr<AWeapon>::operator&(&this->PremorphWeapon);
  if (*ppAVar3 == (AWeapon *)old) {
    TObjPtr<AWeapon>::operator=(&this->PremorphWeapon,(AWeapon *)rep);
    local_30 = local_30 + 1;
  }
  pDVar4 = ::TObjPtr::operator_cast_to_DPSprite_((TObjPtr *)&this->psprites);
  if (pDVar4 == (DPSprite *)old) {
    TObjPtr<DPSprite>::operator=(&this->psprites,(DPSprite *)rep);
    local_30 = local_30 + 1;
  }
  ppAVar1 = TObjPtr<AActor>::operator&(&this->ConversationNPC);
  if (*ppAVar1 == (AActor *)old) {
    TObjPtr<AActor>::operator=(&this->ConversationNPC,(AActor *)rep);
    local_30 = local_30 + 1;
  }
  ppAVar1 = TObjPtr<AActor>::operator&(&this->ConversationPC);
  if (*ppAVar1 == (AActor *)old) {
    TObjPtr<AActor>::operator=(&this->ConversationPC,(AActor *)rep);
    local_30 = local_30 + 1;
  }
  ppAVar1 = TObjPtr<AActor>::operator&(&this->MUSINFOactor);
  if (*ppAVar1 == (AActor *)old) {
    TObjPtr<AActor>::operator=(&this->MUSINFOactor,(AActor *)rep);
    local_30 = local_30 + 1;
  }
  return local_30;
}

Assistant:

size_t player_t::FixPointers (const DObject *old, DObject *rep)
{
	APlayerPawn *replacement = static_cast<APlayerPawn *>(rep);
	size_t changed = 0;

	// The construct *& is used in several of these to avoid the read barriers
	// that would turn the pointer we want to check to NULL if the old object
	// is pending deletion.
	if (mo == old)					mo = replacement, changed++;
	if (*&poisoner == old)			poisoner = replacement, changed++;
	if (*&attacker == old)			attacker = replacement, changed++;
	if (*&camera == old)			camera = replacement, changed++;
	if (*&Bot == old)				Bot = static_cast<DBot *>(rep), changed++;
	if (ReadyWeapon == old)			ReadyWeapon = static_cast<AWeapon *>(rep), changed++;
	if (PendingWeapon == old)		PendingWeapon = static_cast<AWeapon *>(rep), changed++;
	if (*&PremorphWeapon == old)	PremorphWeapon = static_cast<AWeapon *>(rep), changed++;
	if (psprites == old)			psprites = static_cast<DPSprite *>(rep), changed++;
	if (*&ConversationNPC == old)	ConversationNPC = replacement, changed++;
	if (*&ConversationPC == old)	ConversationPC = replacement, changed++;
	if (*&MUSINFOactor == old)		MUSINFOactor = replacement, changed++;
	return changed;
}